

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_test.c
# Opt level: O1

void test_udp_send_ipc(void)

{
  nng_err nVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  undefined1 local_150 [8];
  nng_sockaddr sa1;
  nng_sockaddr sa2;
  nng_iov iov1;
  char msg [6];
  nng_udp *u1;
  nng_aio *aio1;
  
  memset((nng_sockaddr *)local_150,0,0x88);
  memset(sa1.s_ipc.sa_path + 0x7e,0,0x88);
  iov1.iov_len._4_2_ = 0x6f;
  iov1.iov_len._0_4_ = 0x6c6c6568;
  local_150._0_2_ = 3;
  local_150._2_2_ = 0;
  local_150._4_4_ = 0x100007f;
  sa1.s_storage.sa_pad[0xf]._0_2_ = 2;
  sVar3 = strlen((char *)((long)sa1.s_storage.sa_pad + 0x7a));
  *(undefined8 *)((long)&sa1 + sVar3 + 0x82) = 0x676f622f706d742f;
  *(undefined4 *)((long)&sa2 + sVar3 + 1) = 0x737567;
  nVar1 = nng_udp_open((nng_udp **)msg,(nng_sockaddr *)local_150);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                         ,0x132,"%s: expected success, got %s (%d)","nng_udp_open(&u1, &sa1)",pcVar4
                         ,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_udp_sockname(_msg,(nng_sockaddr *)local_150);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                           ,0x133,"%s: expected success, got %s (%d)","nng_udp_sockname(u1, &sa1)",
                           pcVar4,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_aio_alloc((nng_aio **)&u1,(_func_void_void_ptr *)0x0,(void *)0x0);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                             ,0x135,"%s: expected success, got %s (%d)",
                             "nng_aio_alloc(&aio1, NULL, NULL)",pcVar4,nVar1);
      if (iVar2 != 0) {
        sa2.s_storage.sa_pad[0xf] = (uint64_t)&iov1.iov_len;
        sVar3 = strlen((char *)sa2.s_storage.sa_pad[0xf]);
        iov1.iov_buf = (void *)(sVar3 + 1);
        nVar1 = nng_aio_set_iov((nng_aio *)u1,1,(nng_iov *)(sa2.s_ipc.sa_path + 0x7e));
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                               ,0x139,"%s: expected success, got %s (%d)",
                               "nng_aio_set_iov(aio1, 1, &iov1)",pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_aio_set_input((nng_aio *)u1,0,sa1.s_ipc.sa_path + 0x7e);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                                 ,0x13a,"%s: expected success, got %s (%d)",
                                 "nng_aio_set_input(aio1, 0, &sa2)",pcVar4,nVar1);
          if (iVar2 != 0) {
            nng_udp_send(_msg,(nng_aio *)u1);
            nng_aio_wait((nng_aio *)u1);
            nVar1 = nng_aio_result((nng_aio *)u1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_ENOTSUP || nVar1 == NNG_EADDRINVAL),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/udp_test.c"
                                   ,0x140,"%s","rv == NNG_EADDRINVAL || rv == NNG_ENOTSUP");
            if (iVar2 != 0) {
              nng_aio_free((nng_aio *)u1);
              nng_udp_close(_msg);
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_udp_send_ipc(void)
{
	nng_sockaddr sa1 = { 0 };
	nng_sockaddr sa2 = { 0 };
	nng_udp     *u1;
	uint32_t     loopback;
	nng_aio     *aio1;
	nng_iov      iov1;
	char         msg[] = "hello";
	int          rv;

	loopback = htonl(0x7f000001); // 127.0.0.1

	sa1.s_in.sa_family = NNG_AF_INET;
	sa1.s_in.sa_addr   = loopback;
	sa1.s_in.sa_port   = 0; // wild card port binding

	sa2.s_ipc.sa_family = NNG_AF_IPC;
	strcat(sa2.s_ipc.sa_path, "/tmp/bogus");

	NUTS_PASS(nng_udp_open(&u1, &sa1));
	NUTS_PASS(nng_udp_sockname(u1, &sa1));

	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));

	iov1.iov_buf = msg;
	iov1.iov_len = strlen(msg) + 1;
	NUTS_PASS(nng_aio_set_iov(aio1, 1, &iov1));
	NUTS_PASS(nng_aio_set_input(aio1, 0, &sa2));

	nng_udp_send(u1, aio1);
	nng_aio_wait(aio1);

	rv = nng_aio_result(aio1);
	NUTS_ASSERT(rv == NNG_EADDRINVAL || rv == NNG_ENOTSUP);

	nng_aio_free(aio1);
	nng_udp_close(u1);
}